

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_strip_surrounding_spaces(char *string,char **dest,size_t *length)

{
  size_t sStack_40;
  natwm_error err;
  size_t length_result;
  size_t end;
  size_t start;
  size_t *length_local;
  char **dest_local;
  char *string_local;
  
  end = 0;
  length_result = 0;
  sStack_40 = 0;
  start = (size_t)length;
  length_local = (size_t *)dest;
  dest_local = (char **)string;
  string_local._4_4_ = string_find_first_nonspace(string,&end);
  if (((string_local._4_4_ == NO_ERROR) &&
      (string_local._4_4_ = string_find_last_nonspace((char *)dest_local,&length_result),
      string_local._4_4_ == NO_ERROR)) &&
     (string_local._4_4_ =
           string_splice((char *)dest_local,end,length_result + 1,(char **)length_local,
                         &stack0xffffffffffffffc0), start != 0)) {
    *(size_t *)start = sStack_40;
  }
  return string_local._4_4_;
}

Assistant:

enum natwm_error string_strip_surrounding_spaces(const char *string, char **dest, size_t *length)
{
        size_t start = 0;
        size_t end = 0;
        size_t length_result = 0;
        enum natwm_error err = GENERIC_ERROR;

        err = string_find_first_nonspace(string, &start);

        if (err != NO_ERROR) {
                return err;
        }

        err = string_find_last_nonspace(string, &end);

        if (err != NO_ERROR) {
                return err;
        }

        err = string_splice(string, start, end + 1, dest, &length_result);

        SET_IF_NON_NULL(length, length_result);

        return err;
}